

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNewLineStyle.cxx
# Opt level: O0

bool __thiscall
cmNewLineStyle::ReadFromArguments
          (cmNewLineStyle *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,string *errorString)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  string *eol;
  size_t styleIndex;
  size_t i;
  string *errorString_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmNewLineStyle *this_local;
  
  this->NewLineStyle = Invalid;
  styleIndex = 0;
  while( true ) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    if (sVar2 <= styleIndex) {
      return true;
    }
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,styleIndex);
    bVar1 = std::operator==(pvVar3,"NEWLINE_STYLE");
    if (bVar1) break;
    styleIndex = styleIndex + 1;
  }
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 <= styleIndex + 1) {
    std::__cxx11::string::operator=
              ((string *)errorString,"NEWLINE_STYLE must set a style: LF, CRLF, UNIX, DOS, or WIN32"
              );
    return false;
  }
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,styleIndex + 1);
  bVar1 = std::operator==(pvVar3,"LF");
  if ((bVar1) || (bVar1 = std::operator==(pvVar3,"UNIX"), bVar1)) {
    this->NewLineStyle = LF;
    return true;
  }
  bVar1 = std::operator==(pvVar3,"CRLF");
  if ((!bVar1) &&
     ((bVar1 = std::operator==(pvVar3,"WIN32"), !bVar1 &&
      (bVar1 = std::operator==(pvVar3,"DOS"), !bVar1)))) {
    std::__cxx11::string::operator=
              ((string *)errorString,
               "NEWLINE_STYLE sets an unknown style, only LF, CRLF, UNIX, DOS, and WIN32 are supported"
              );
    return false;
  }
  this->NewLineStyle = CRLF;
  return true;
}

Assistant:

bool cmNewLineStyle::ReadFromArguments(const std::vector<std::string>& args,
                                       std::string& errorString)
{
  NewLineStyle = Invalid;

  for (size_t i = 0; i < args.size(); i++) {
    if (args[i] == "NEWLINE_STYLE") {
      size_t const styleIndex = i + 1;
      if (args.size() > styleIndex) {
        std::string const& eol = args[styleIndex];
        if (eol == "LF" || eol == "UNIX") {
          NewLineStyle = LF;
          return true;
        }
        if (eol == "CRLF" || eol == "WIN32" || eol == "DOS") {
          NewLineStyle = CRLF;
          return true;
        }
        errorString = "NEWLINE_STYLE sets an unknown style, only LF, "
                      "CRLF, UNIX, DOS, and WIN32 are supported";
        return false;
      }
      errorString = "NEWLINE_STYLE must set a style: "
                    "LF, CRLF, UNIX, DOS, or WIN32";
      return false;
    }
  }
  return true;
}